

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O3

void __thiscall cnn::AdagradTrainer::update(AdagradTrainer *this,real scale)

{
  real rVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer pSVar5;
  pointer pSVar6;
  pointer ppPVar7;
  Parameters *this_00;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  pointer ppLVar12;
  LookupParameters *this_01;
  pointer pTVar13;
  pointer pTVar14;
  bool bVar15;
  byte bVar16;
  float fVar17;
  float fVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  byte bVar21;
  pointer pSVar22;
  pointer pSVar23;
  Model *pMVar24;
  _Hash_node_base *p_Var25;
  ulong uVar26;
  pointer ppLVar27;
  ulong uVar28;
  char *pcVar29;
  Index size_1;
  Index index;
  long lVar30;
  uint uVar31;
  Index index_3;
  uint uVar32;
  Index index_2;
  uint uVar33;
  Index size;
  ulong uVar34;
  Index index_1;
  ulong uVar35;
  ulong uVar36;
  Index index_5;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  Index index_4;
  pointer ppPVar40;
  ushort uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  float fVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  undefined1 auVar78 [16];
  undefined1 in_ZMM13 [64];
  undefined1 in_ZMM14 [64];
  ulong local_c8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  float local_70;
  float *local_64;
  ulong local_54;
  float *local_3c;
  
  if (this->shadow_params_allocated == false) {
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_a8,
               (this->super_Trainer).model);
    pSVar5 = (this->vp).
             super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(uStack_94,uStack_98);
    pSVar22 = (this->vp).
              super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar23 = (this->vp).
              super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(fStack_a4,local_a8);
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(fStack_9c,fStack_a0);
    local_a8 = 0.0;
    uStack_98 = 0;
    uStack_94 = 0;
    fStack_a4 = 0.0;
    fStack_a0 = 0.0;
    fStack_9c = 0.0;
    local_88 = SUB84(pSVar22,0);
    fStack_84 = (float)((ulong)pSVar22 >> 0x20);
    fStack_80 = SUB84(pSVar23,0);
    fStack_7c = (float)((ulong)pSVar23 >> 0x20);
    uStack_78 = SUB84(pSVar5,0);
    uStack_74 = (undefined4)((ulong)pSVar5 >> 0x20);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_88);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_a8);
    AllocateShadowLookupParameters
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_a8,(this->super_Trainer).model);
    pSVar6 = (this->vlp).
             super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(uStack_94,uStack_98);
    uVar3 = (this->vlp).
            super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
            ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (this->vlp).
            super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(fStack_a4,local_a8);
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(fStack_9c,fStack_a0);
    local_a8 = 0.0;
    uStack_98 = 0;
    uStack_94 = 0;
    fStack_a4 = 0.0;
    fStack_a0 = 0.0;
    fStack_9c = 0.0;
    local_88 = (float)uVar3;
    fStack_84 = (float)((ulong)uVar3 >> 0x20);
    fStack_80 = (float)uVar4;
    fStack_7c = (float)((ulong)uVar4 >> 0x20);
    uStack_78 = SUB84(pSVar6,0);
    uStack_74 = (undefined4)((ulong)pSVar6 >> 0x20);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_88);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              ((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *)
               &local_a8);
    this->shadow_params_allocated = true;
  }
  fVar74 = Trainer::clip_gradients(&this->super_Trainer);
  pMVar24 = (this->super_Trainer).model;
  ppPVar7 = (pMVar24->params).
            super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppPVar40 = (pMVar24->params).
             super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppPVar40 != ppPVar7) {
    auVar47 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
    in_ZMM14 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
    auVar48 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
    auVar49 = vpbroadcastd_avx512f(ZEXT416(0x7fffff));
    auVar50 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar51 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar52 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar53 = vpternlogd_avx512f(in_ZMM13,in_ZMM13,in_ZMM13,0xff);
    uVar34 = 0;
    do {
      local_a8 = fVar74 * scale;
      this_00 = *ppPVar40;
      iVar76 = 1;
      iVar75 = 1;
      uVar36 = (ulong)(this_00->values).d.nd;
      if (uVar36 != 0) {
        auVar54 = vmovdqa64_avx512f(auVar50);
        auVar55 = vpbroadcastq_avx512f();
        uVar26 = 0;
        do {
          auVar56 = vpbroadcastq_avx512f();
          auVar57 = vmovdqa64_avx512f(auVar54);
          auVar54 = vporq_avx512f(auVar56,auVar51);
          auVar56 = vporq_avx512f(auVar56,auVar52);
          uVar19 = vpcmpuq_avx512f(auVar56,auVar55,2);
          bVar16 = (byte)uVar19;
          uVar19 = vpcmpuq_avx512f(auVar54,auVar55,2);
          bVar21 = (byte)uVar19;
          uVar41 = CONCAT11(bVar21,bVar16);
          auVar54 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar26));
          auVar56._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar54._4_4_;
          auVar56._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
          auVar56._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar54._8_4_;
          auVar56._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar54._12_4_;
          auVar56._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar54._16_4_;
          auVar56._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar54._20_4_;
          auVar56._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar54._24_4_;
          auVar56._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar54._28_4_;
          auVar56._32_4_ = (uint)(bVar21 & 1) * auVar54._32_4_;
          auVar56._36_4_ = (uint)(bVar21 >> 1 & 1) * auVar54._36_4_;
          auVar56._40_4_ = (uint)(bVar21 >> 2 & 1) * auVar54._40_4_;
          auVar56._44_4_ = (uint)(bVar21 >> 3 & 1) * auVar54._44_4_;
          auVar56._48_4_ = (uint)(bVar21 >> 4 & 1) * auVar54._48_4_;
          auVar56._52_4_ = (uint)(bVar21 >> 5 & 1) * auVar54._52_4_;
          auVar56._56_4_ = (uint)(bVar21 >> 6 & 1) * auVar54._56_4_;
          auVar56._60_4_ = (uint)(bVar21 >> 7) * auVar54._60_4_;
          uVar26 = uVar26 + 0x10;
          auVar54 = vpmulld_avx512f(auVar56,auVar57);
        } while ((uVar36 + 0xf & 0x1fffffff0) != uVar26);
        auVar55 = vmovdqa32_avx512f(auVar54);
        auVar54._0_4_ =
             (uint)(bVar16 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar57._0_4_;
        bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
        auVar54._4_4_ = (uint)bVar15 * auVar55._4_4_ | (uint)!bVar15 * auVar57._4_4_;
        bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
        auVar54._8_4_ = (uint)bVar15 * auVar55._8_4_ | (uint)!bVar15 * auVar57._8_4_;
        bVar15 = (bool)((byte)(uVar41 >> 3) & 1);
        auVar54._12_4_ = (uint)bVar15 * auVar55._12_4_ | (uint)!bVar15 * auVar57._12_4_;
        bVar15 = (bool)((byte)(uVar41 >> 4) & 1);
        auVar54._16_4_ = (uint)bVar15 * auVar55._16_4_ | (uint)!bVar15 * auVar57._16_4_;
        bVar15 = (bool)((byte)(uVar41 >> 5) & 1);
        auVar54._20_4_ = (uint)bVar15 * auVar55._20_4_ | (uint)!bVar15 * auVar57._20_4_;
        bVar15 = (bool)((byte)(uVar41 >> 6) & 1);
        auVar54._24_4_ = (uint)bVar15 * auVar55._24_4_ | (uint)!bVar15 * auVar57._24_4_;
        bVar15 = (bool)((byte)(uVar41 >> 7) & 1);
        auVar54._28_4_ = (uint)bVar15 * auVar55._28_4_ | (uint)!bVar15 * auVar57._28_4_;
        auVar54._32_4_ =
             (uint)(bVar21 & 1) * auVar55._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar57._32_4_;
        bVar15 = (bool)(bVar21 >> 1 & 1);
        auVar54._36_4_ = (uint)bVar15 * auVar55._36_4_ | (uint)!bVar15 * auVar57._36_4_;
        bVar15 = (bool)(bVar21 >> 2 & 1);
        auVar54._40_4_ = (uint)bVar15 * auVar55._40_4_ | (uint)!bVar15 * auVar57._40_4_;
        bVar15 = (bool)(bVar21 >> 3 & 1);
        auVar54._44_4_ = (uint)bVar15 * auVar55._44_4_ | (uint)!bVar15 * auVar57._44_4_;
        bVar15 = (bool)(bVar21 >> 4 & 1);
        auVar54._48_4_ = (uint)bVar15 * auVar55._48_4_ | (uint)!bVar15 * auVar57._48_4_;
        bVar15 = (bool)(bVar21 >> 5 & 1);
        auVar54._52_4_ = (uint)bVar15 * auVar55._52_4_ | (uint)!bVar15 * auVar57._52_4_;
        bVar15 = (bool)(bVar21 >> 6 & 1);
        auVar54._56_4_ = (uint)bVar15 * auVar55._56_4_ | (uint)!bVar15 * auVar57._56_4_;
        auVar54._60_4_ =
             (uint)(bVar21 >> 7) * auVar55._60_4_ | (uint)!(bool)(bVar21 >> 7) * auVar57._60_4_;
        auVar46 = vextracti64x4_avx512f(auVar54,1);
        auVar54 = vpmulld_avx512f(auVar54,ZEXT3264(auVar46));
        auVar42 = vpmulld_avx(auVar54._0_16_,auVar54._16_16_);
        auVar44 = vpshufd_avx(auVar42,0xee);
        auVar42 = vpmulld_avx(auVar42,auVar44);
        auVar44 = vpshufd_avx(auVar42,0x55);
        auVar42 = vpmulld_avx(auVar42,auVar44);
        iVar75 = auVar42._0_4_;
      }
      uVar36 = (ulong)(this_00->g).d.nd;
      if (uVar36 != 0) {
        auVar54 = vmovdqa64_avx512f(auVar50);
        auVar55 = vpbroadcastq_avx512f();
        uVar26 = 0;
        do {
          auVar56 = vpbroadcastq_avx512f();
          auVar57 = vmovdqa64_avx512f(auVar54);
          auVar54 = vporq_avx512f(auVar56,auVar51);
          auVar56 = vporq_avx512f(auVar56,auVar52);
          uVar19 = vpcmpuq_avx512f(auVar56,auVar55,2);
          bVar16 = (byte)uVar19;
          uVar19 = vpcmpuq_avx512f(auVar54,auVar55,2);
          bVar21 = (byte)uVar19;
          uVar41 = CONCAT11(bVar21,bVar16);
          auVar54 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->g).d.d + uVar26));
          auVar58._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar54._4_4_;
          auVar58._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
          auVar58._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar54._8_4_;
          auVar58._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar54._12_4_;
          auVar58._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar54._16_4_;
          auVar58._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar54._20_4_;
          auVar58._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar54._24_4_;
          auVar58._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar54._28_4_;
          auVar58._32_4_ = (uint)(bVar21 & 1) * auVar54._32_4_;
          auVar58._36_4_ = (uint)(bVar21 >> 1 & 1) * auVar54._36_4_;
          auVar58._40_4_ = (uint)(bVar21 >> 2 & 1) * auVar54._40_4_;
          auVar58._44_4_ = (uint)(bVar21 >> 3 & 1) * auVar54._44_4_;
          auVar58._48_4_ = (uint)(bVar21 >> 4 & 1) * auVar54._48_4_;
          auVar58._52_4_ = (uint)(bVar21 >> 5 & 1) * auVar54._52_4_;
          auVar58._56_4_ = (uint)(bVar21 >> 6 & 1) * auVar54._56_4_;
          auVar58._60_4_ = (uint)(bVar21 >> 7) * auVar54._60_4_;
          uVar26 = uVar26 + 0x10;
          auVar54 = vpmulld_avx512f(auVar58,auVar57);
        } while ((uVar36 + 0xf & 0x1fffffff0) != uVar26);
        auVar54 = vmovdqa32_avx512f(auVar54);
        auVar55._0_4_ =
             (uint)(bVar16 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar57._0_4_;
        bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
        auVar55._4_4_ = (uint)bVar15 * auVar54._4_4_ | (uint)!bVar15 * auVar57._4_4_;
        bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
        auVar55._8_4_ = (uint)bVar15 * auVar54._8_4_ | (uint)!bVar15 * auVar57._8_4_;
        bVar15 = (bool)((byte)(uVar41 >> 3) & 1);
        auVar55._12_4_ = (uint)bVar15 * auVar54._12_4_ | (uint)!bVar15 * auVar57._12_4_;
        bVar15 = (bool)((byte)(uVar41 >> 4) & 1);
        auVar55._16_4_ = (uint)bVar15 * auVar54._16_4_ | (uint)!bVar15 * auVar57._16_4_;
        bVar15 = (bool)((byte)(uVar41 >> 5) & 1);
        auVar55._20_4_ = (uint)bVar15 * auVar54._20_4_ | (uint)!bVar15 * auVar57._20_4_;
        bVar15 = (bool)((byte)(uVar41 >> 6) & 1);
        auVar55._24_4_ = (uint)bVar15 * auVar54._24_4_ | (uint)!bVar15 * auVar57._24_4_;
        bVar15 = (bool)((byte)(uVar41 >> 7) & 1);
        auVar55._28_4_ = (uint)bVar15 * auVar54._28_4_ | (uint)!bVar15 * auVar57._28_4_;
        auVar55._32_4_ =
             (uint)(bVar21 & 1) * auVar54._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar57._32_4_;
        bVar15 = (bool)(bVar21 >> 1 & 1);
        auVar55._36_4_ = (uint)bVar15 * auVar54._36_4_ | (uint)!bVar15 * auVar57._36_4_;
        bVar15 = (bool)(bVar21 >> 2 & 1);
        auVar55._40_4_ = (uint)bVar15 * auVar54._40_4_ | (uint)!bVar15 * auVar57._40_4_;
        bVar15 = (bool)(bVar21 >> 3 & 1);
        auVar55._44_4_ = (uint)bVar15 * auVar54._44_4_ | (uint)!bVar15 * auVar57._44_4_;
        bVar15 = (bool)(bVar21 >> 4 & 1);
        auVar55._48_4_ = (uint)bVar15 * auVar54._48_4_ | (uint)!bVar15 * auVar57._48_4_;
        bVar15 = (bool)(bVar21 >> 5 & 1);
        auVar55._52_4_ = (uint)bVar15 * auVar54._52_4_ | (uint)!bVar15 * auVar57._52_4_;
        bVar15 = (bool)(bVar21 >> 6 & 1);
        auVar55._56_4_ = (uint)bVar15 * auVar54._56_4_ | (uint)!bVar15 * auVar57._56_4_;
        auVar55._60_4_ =
             (uint)(bVar21 >> 7) * auVar54._60_4_ | (uint)!(bool)(bVar21 >> 7) * auVar57._60_4_;
        auVar46 = vextracti64x4_avx512f(auVar55,1);
        auVar54 = vpmulld_avx512f(auVar55,ZEXT3264(auVar46));
        auVar42 = vpmulld_avx(auVar54._0_16_,auVar54._16_16_);
        auVar44 = vpshufd_avx(auVar42,0xee);
        auVar42 = vpmulld_avx(auVar42,auVar44);
        auVar44 = vpshufd_avx(auVar42,0x55);
        auVar42 = vpmulld_avx(auVar42,auVar44);
        iVar76 = auVar42._0_4_;
      }
      pSVar5 = (this->vp).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar36 = (ulong)pSVar5[uVar34].h.d.nd;
      if (uVar36 == 0) {
        iVar77 = 1;
      }
      else {
        auVar54 = vmovdqa64_avx512f(auVar50);
        auVar55 = vpbroadcastq_avx512f();
        uVar26 = 0;
        do {
          auVar56 = vpbroadcastq_avx512f();
          auVar57 = vmovdqa64_avx512f(auVar54);
          auVar54 = vporq_avx512f(auVar56,auVar51);
          auVar56 = vporq_avx512f(auVar56,auVar52);
          uVar19 = vpcmpuq_avx512f(auVar56,auVar55,2);
          bVar16 = (byte)uVar19;
          uVar19 = vpcmpuq_avx512f(auVar54,auVar55,2);
          bVar21 = (byte)uVar19;
          uVar41 = CONCAT11(bVar21,bVar16);
          auVar54 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar5[uVar34].h.d.d + uVar26 * 4));
          auVar69._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar54._4_4_;
          auVar69._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
          auVar69._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar54._8_4_;
          auVar69._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar54._12_4_;
          auVar69._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar54._16_4_;
          auVar69._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar54._20_4_;
          auVar69._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar54._24_4_;
          auVar69._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar54._28_4_;
          auVar69._32_4_ = (uint)(bVar21 & 1) * auVar54._32_4_;
          auVar69._36_4_ = (uint)(bVar21 >> 1 & 1) * auVar54._36_4_;
          auVar69._40_4_ = (uint)(bVar21 >> 2 & 1) * auVar54._40_4_;
          auVar69._44_4_ = (uint)(bVar21 >> 3 & 1) * auVar54._44_4_;
          auVar69._48_4_ = (uint)(bVar21 >> 4 & 1) * auVar54._48_4_;
          auVar69._52_4_ = (uint)(bVar21 >> 5 & 1) * auVar54._52_4_;
          auVar69._56_4_ = (uint)(bVar21 >> 6 & 1) * auVar54._56_4_;
          auVar69._60_4_ = (uint)(bVar21 >> 7) * auVar54._60_4_;
          uVar26 = uVar26 + 0x10;
          auVar54 = vpmulld_avx512f(auVar69,auVar57);
        } while ((uVar36 + 0xf & 0x1fffffff0) != uVar26);
        auVar54 = vmovdqa32_avx512f(auVar54);
        auVar70._0_4_ =
             (uint)(bVar16 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar57._0_4_;
        bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
        auVar70._4_4_ = (uint)bVar15 * auVar54._4_4_ | (uint)!bVar15 * auVar57._4_4_;
        bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
        auVar70._8_4_ = (uint)bVar15 * auVar54._8_4_ | (uint)!bVar15 * auVar57._8_4_;
        bVar15 = (bool)((byte)(uVar41 >> 3) & 1);
        auVar70._12_4_ = (uint)bVar15 * auVar54._12_4_ | (uint)!bVar15 * auVar57._12_4_;
        bVar15 = (bool)((byte)(uVar41 >> 4) & 1);
        auVar70._16_4_ = (uint)bVar15 * auVar54._16_4_ | (uint)!bVar15 * auVar57._16_4_;
        bVar15 = (bool)((byte)(uVar41 >> 5) & 1);
        auVar70._20_4_ = (uint)bVar15 * auVar54._20_4_ | (uint)!bVar15 * auVar57._20_4_;
        bVar15 = (bool)((byte)(uVar41 >> 6) & 1);
        auVar70._24_4_ = (uint)bVar15 * auVar54._24_4_ | (uint)!bVar15 * auVar57._24_4_;
        bVar15 = (bool)((byte)(uVar41 >> 7) & 1);
        auVar70._28_4_ = (uint)bVar15 * auVar54._28_4_ | (uint)!bVar15 * auVar57._28_4_;
        auVar70._32_4_ =
             (uint)(bVar21 & 1) * auVar54._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar57._32_4_;
        bVar15 = (bool)(bVar21 >> 1 & 1);
        auVar70._36_4_ = (uint)bVar15 * auVar54._36_4_ | (uint)!bVar15 * auVar57._36_4_;
        bVar15 = (bool)(bVar21 >> 2 & 1);
        auVar70._40_4_ = (uint)bVar15 * auVar54._40_4_ | (uint)!bVar15 * auVar57._40_4_;
        bVar15 = (bool)(bVar21 >> 3 & 1);
        auVar70._44_4_ = (uint)bVar15 * auVar54._44_4_ | (uint)!bVar15 * auVar57._44_4_;
        bVar15 = (bool)(bVar21 >> 4 & 1);
        auVar70._48_4_ = (uint)bVar15 * auVar54._48_4_ | (uint)!bVar15 * auVar57._48_4_;
        bVar15 = (bool)(bVar21 >> 5 & 1);
        auVar70._52_4_ = (uint)bVar15 * auVar54._52_4_ | (uint)!bVar15 * auVar57._52_4_;
        bVar15 = (bool)(bVar21 >> 6 & 1);
        auVar70._56_4_ = (uint)bVar15 * auVar54._56_4_ | (uint)!bVar15 * auVar57._56_4_;
        auVar70._60_4_ =
             (uint)(bVar21 >> 7) * auVar54._60_4_ | (uint)!(bool)(bVar21 >> 7) * auVar57._60_4_;
        auVar46 = vextracti64x4_avx512f(auVar70,1);
        auVar54 = vpmulld_avx512f(auVar70,ZEXT3264(auVar46));
        auVar42 = vpmulld_avx(auVar54._0_16_,auVar54._16_16_);
        auVar44 = vpshufd_avx(auVar42,0xee);
        auVar42 = vpmulld_avx(auVar42,auVar44);
        auVar44 = vpshufd_avx(auVar42,0x55);
        auVar42 = vpmulld_avx(auVar42,auVar44);
        iVar77 = auVar42._0_4_;
      }
      rVar1 = (this->super_Trainer).lambda;
      uVar31 = iVar75 * (this_00->values).d.bd;
      uVar32 = iVar76 * (this_00->g).d.bd;
      uVar33 = iVar77 * pSVar5[uVar34].h.d.bd;
      uVar36 = (ulong)uVar33;
      pfVar8 = (this_00->values).v;
      pfVar9 = (this_00->g).v;
      pfVar10 = pSVar5[uVar34].h.v;
      fStack_7c = SUB84(pfVar9,0);
      uStack_78 = (undefined4)((ulong)pfVar9 >> 0x20);
      if (uVar33 != uVar32) goto LAB_00229a92;
      uVar26 = uVar36;
      if ((((ulong)pfVar10 & 3) == 0) &&
         (uVar26 = (ulong)(-((uint)((ulong)pfVar10 >> 2) & 0x3fffffff) & 0xf), uVar36 <= uVar26)) {
        uVar26 = uVar36;
      }
      uVar37 = uVar36 - uVar26;
      uVar35 = uVar37 + 0xf;
      if (-1 < (long)uVar37) {
        uVar35 = uVar37;
      }
      if (uVar26 != 0) {
        uVar38 = 0;
        do {
          auVar42 = vfmadd213ss_fma(ZEXT416((uint)(local_a8 * pfVar9[uVar38])),
                                    ZEXT416((uint)(local_a8 * pfVar9[uVar38])),
                                    ZEXT416((uint)pfVar10[uVar38]));
          pfVar10[uVar38] = auVar42._0_4_;
          uVar38 = uVar38 + 1;
        } while (uVar26 != uVar38);
      }
      uVar35 = (uVar35 & 0xfffffffffffffff0) + uVar26;
      if (0xf < (long)uVar37) {
        auVar42._0_4_ = local_a8 * local_a8;
        auVar42._4_4_ = fStack_a4 * fStack_84;
        auVar42._8_4_ = fStack_a0 * fStack_80;
        auVar42._12_4_ = fStack_7c * fStack_7c;
        auVar54 = vbroadcastss_avx512f(auVar42);
        do {
          auVar55 = vmulps_avx512f(*(undefined1 (*) [64])(pfVar9 + uVar26),
                                   *(undefined1 (*) [64])(pfVar9 + uVar26));
          auVar55 = vfmadd213ps_avx512f(auVar55,auVar54,*(undefined1 (*) [64])(pfVar10 + uVar26));
          *(undefined1 (*) [64])(pfVar10 + uVar26) = auVar55;
          uVar26 = uVar26 + 0x10;
        } while ((long)uVar26 < (long)uVar35);
      }
      if ((long)uVar35 < (long)uVar36) {
        do {
          auVar42 = vfmadd213ss_fma(ZEXT416((uint)(local_a8 * pfVar9[uVar35])),
                                    ZEXT416((uint)(local_a8 * pfVar9[uVar35])),
                                    ZEXT416((uint)pfVar10[uVar35]));
          pfVar10[uVar35] = auVar42._0_4_;
          uVar35 = uVar35 + 1;
        } while (uVar36 != uVar35);
      }
      pfVar10 = pSVar5[uVar34].h.v;
      uVar36 = (ulong)pSVar5[uVar34].h.d.nd;
      if (uVar36 == 0) {
        iVar75 = 1;
      }
      else {
        auVar54 = vmovdqa64_avx512f(auVar50);
        auVar55 = vpbroadcastq_avx512f();
        uVar26 = 0;
        do {
          auVar56 = vpbroadcastq_avx512f();
          auVar57 = vmovdqa64_avx512f(auVar54);
          auVar54 = vporq_avx512f(auVar56,auVar51);
          auVar56 = vporq_avx512f(auVar56,auVar52);
          uVar19 = vpcmpuq_avx512f(auVar56,auVar55,2);
          bVar16 = (byte)uVar19;
          uVar19 = vpcmpuq_avx512f(auVar54,auVar55,2);
          bVar21 = (byte)uVar19;
          uVar41 = CONCAT11(bVar21,bVar16);
          auVar54 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar5[uVar34].h.d.d + uVar26 * 4));
          auVar71._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar54._4_4_;
          auVar71._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
          auVar71._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar54._8_4_;
          auVar71._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar54._12_4_;
          auVar71._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar54._16_4_;
          auVar71._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar54._20_4_;
          auVar71._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar54._24_4_;
          auVar71._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar54._28_4_;
          auVar71._32_4_ = (uint)(bVar21 & 1) * auVar54._32_4_;
          auVar71._36_4_ = (uint)(bVar21 >> 1 & 1) * auVar54._36_4_;
          auVar71._40_4_ = (uint)(bVar21 >> 2 & 1) * auVar54._40_4_;
          auVar71._44_4_ = (uint)(bVar21 >> 3 & 1) * auVar54._44_4_;
          auVar71._48_4_ = (uint)(bVar21 >> 4 & 1) * auVar54._48_4_;
          auVar71._52_4_ = (uint)(bVar21 >> 5 & 1) * auVar54._52_4_;
          auVar71._56_4_ = (uint)(bVar21 >> 6 & 1) * auVar54._56_4_;
          auVar71._60_4_ = (uint)(bVar21 >> 7) * auVar54._60_4_;
          uVar26 = uVar26 + 0x10;
          auVar54 = vpmulld_avx512f(auVar71,auVar57);
        } while ((uVar36 + 0xf & 0x1fffffff0) != uVar26);
        auVar54 = vmovdqa32_avx512f(auVar54);
        auVar72._0_4_ =
             (uint)(bVar16 & 1) * auVar54._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar57._0_4_;
        bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
        auVar72._4_4_ = (uint)bVar15 * auVar54._4_4_ | (uint)!bVar15 * auVar57._4_4_;
        bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
        auVar72._8_4_ = (uint)bVar15 * auVar54._8_4_ | (uint)!bVar15 * auVar57._8_4_;
        bVar15 = (bool)((byte)(uVar41 >> 3) & 1);
        auVar72._12_4_ = (uint)bVar15 * auVar54._12_4_ | (uint)!bVar15 * auVar57._12_4_;
        bVar15 = (bool)((byte)(uVar41 >> 4) & 1);
        auVar72._16_4_ = (uint)bVar15 * auVar54._16_4_ | (uint)!bVar15 * auVar57._16_4_;
        bVar15 = (bool)((byte)(uVar41 >> 5) & 1);
        auVar72._20_4_ = (uint)bVar15 * auVar54._20_4_ | (uint)!bVar15 * auVar57._20_4_;
        bVar15 = (bool)((byte)(uVar41 >> 6) & 1);
        auVar72._24_4_ = (uint)bVar15 * auVar54._24_4_ | (uint)!bVar15 * auVar57._24_4_;
        bVar15 = (bool)((byte)(uVar41 >> 7) & 1);
        auVar72._28_4_ = (uint)bVar15 * auVar54._28_4_ | (uint)!bVar15 * auVar57._28_4_;
        auVar72._32_4_ =
             (uint)(bVar21 & 1) * auVar54._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar57._32_4_;
        bVar15 = (bool)(bVar21 >> 1 & 1);
        auVar72._36_4_ = (uint)bVar15 * auVar54._36_4_ | (uint)!bVar15 * auVar57._36_4_;
        bVar15 = (bool)(bVar21 >> 2 & 1);
        auVar72._40_4_ = (uint)bVar15 * auVar54._40_4_ | (uint)!bVar15 * auVar57._40_4_;
        bVar15 = (bool)(bVar21 >> 3 & 1);
        auVar72._44_4_ = (uint)bVar15 * auVar54._44_4_ | (uint)!bVar15 * auVar57._44_4_;
        bVar15 = (bool)(bVar21 >> 4 & 1);
        auVar72._48_4_ = (uint)bVar15 * auVar54._48_4_ | (uint)!bVar15 * auVar57._48_4_;
        bVar15 = (bool)(bVar21 >> 5 & 1);
        auVar72._52_4_ = (uint)bVar15 * auVar54._52_4_ | (uint)!bVar15 * auVar57._52_4_;
        bVar15 = (bool)(bVar21 >> 6 & 1);
        auVar72._56_4_ = (uint)bVar15 * auVar54._56_4_ | (uint)!bVar15 * auVar57._56_4_;
        auVar72._60_4_ =
             (uint)(bVar21 >> 7) * auVar54._60_4_ | (uint)!(bool)(bVar21 >> 7) * auVar57._60_4_;
        auVar46 = vextracti64x4_avx512f(auVar72,1);
        auVar54 = vpmulld_avx512f(auVar72,ZEXT3264(auVar46));
        auVar42 = vpmulld_avx(auVar54._0_16_,auVar54._16_16_);
        auVar44 = vpshufd_avx(auVar42,0xee);
        auVar42 = vpmulld_avx(auVar42,auVar44);
        auVar44 = vpshufd_avx(auVar42,0x55);
        auVar42 = vpmulld_avx(auVar42,auVar44);
        iVar75 = auVar42._0_4_;
      }
      if (uVar32 - iVar75 * pSVar5[uVar34].h.d.bd != 0) goto LAB_00229a7b;
      if (uVar32 != uVar31) goto LAB_00229ab4;
      uVar36 = (ulong)(this_00->values).d.nd;
      if (uVar36 == 0) {
        iVar75 = 1;
      }
      else {
        auVar50 = vmovdqa64_avx512f(auVar50);
        auVar54 = vpbroadcastq_avx512f();
        uVar26 = 0;
        do {
          auVar55 = vpbroadcastq_avx512f();
          auVar56 = vmovdqa64_avx512f(auVar50);
          auVar50 = vporq_avx512f(auVar55,auVar51);
          auVar55 = vporq_avx512f(auVar55,auVar52);
          uVar19 = vpcmpuq_avx512f(auVar55,auVar54,2);
          bVar16 = (byte)uVar19;
          uVar19 = vpcmpuq_avx512f(auVar50,auVar54,2);
          bVar21 = (byte)uVar19;
          uVar41 = CONCAT11(bVar21,bVar16);
          auVar55 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar26));
          auVar50._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar55._4_4_;
          auVar50._0_4_ = (uint)(bVar16 & 1) * auVar55._0_4_;
          auVar50._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar55._8_4_;
          auVar50._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar55._12_4_;
          auVar50._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar55._16_4_;
          auVar50._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar55._20_4_;
          auVar50._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar55._24_4_;
          auVar50._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar55._28_4_;
          auVar50._32_4_ = (uint)(bVar21 & 1) * auVar55._32_4_;
          auVar50._36_4_ = (uint)(bVar21 >> 1 & 1) * auVar55._36_4_;
          auVar50._40_4_ = (uint)(bVar21 >> 2 & 1) * auVar55._40_4_;
          auVar50._44_4_ = (uint)(bVar21 >> 3 & 1) * auVar55._44_4_;
          auVar50._48_4_ = (uint)(bVar21 >> 4 & 1) * auVar55._48_4_;
          auVar50._52_4_ = (uint)(bVar21 >> 5 & 1) * auVar55._52_4_;
          auVar50._56_4_ = (uint)(bVar21 >> 6 & 1) * auVar55._56_4_;
          auVar50._60_4_ = (uint)(bVar21 >> 7) * auVar55._60_4_;
          uVar26 = uVar26 + 0x10;
          auVar50 = vpmulld_avx512f(auVar50,auVar56);
        } while ((uVar36 + 0xf & 0x1fffffff0) != uVar26);
        auVar50 = vmovdqa32_avx512f(auVar50);
        auVar51._0_4_ =
             (uint)(bVar16 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar56._0_4_;
        bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
        auVar51._4_4_ = (uint)bVar15 * auVar50._4_4_ | (uint)!bVar15 * auVar56._4_4_;
        bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
        auVar51._8_4_ = (uint)bVar15 * auVar50._8_4_ | (uint)!bVar15 * auVar56._8_4_;
        bVar15 = (bool)((byte)(uVar41 >> 3) & 1);
        auVar51._12_4_ = (uint)bVar15 * auVar50._12_4_ | (uint)!bVar15 * auVar56._12_4_;
        bVar15 = (bool)((byte)(uVar41 >> 4) & 1);
        auVar51._16_4_ = (uint)bVar15 * auVar50._16_4_ | (uint)!bVar15 * auVar56._16_4_;
        bVar15 = (bool)((byte)(uVar41 >> 5) & 1);
        auVar51._20_4_ = (uint)bVar15 * auVar50._20_4_ | (uint)!bVar15 * auVar56._20_4_;
        bVar15 = (bool)((byte)(uVar41 >> 6) & 1);
        auVar51._24_4_ = (uint)bVar15 * auVar50._24_4_ | (uint)!bVar15 * auVar56._24_4_;
        bVar15 = (bool)((byte)(uVar41 >> 7) & 1);
        auVar51._28_4_ = (uint)bVar15 * auVar50._28_4_ | (uint)!bVar15 * auVar56._28_4_;
        auVar51._32_4_ =
             (uint)(bVar21 & 1) * auVar50._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar56._32_4_;
        bVar15 = (bool)(bVar21 >> 1 & 1);
        auVar51._36_4_ = (uint)bVar15 * auVar50._36_4_ | (uint)!bVar15 * auVar56._36_4_;
        bVar15 = (bool)(bVar21 >> 2 & 1);
        auVar51._40_4_ = (uint)bVar15 * auVar50._40_4_ | (uint)!bVar15 * auVar56._40_4_;
        bVar15 = (bool)(bVar21 >> 3 & 1);
        auVar51._44_4_ = (uint)bVar15 * auVar50._44_4_ | (uint)!bVar15 * auVar56._44_4_;
        bVar15 = (bool)(bVar21 >> 4 & 1);
        auVar51._48_4_ = (uint)bVar15 * auVar50._48_4_ | (uint)!bVar15 * auVar56._48_4_;
        bVar15 = (bool)(bVar21 >> 5 & 1);
        auVar51._52_4_ = (uint)bVar15 * auVar50._52_4_ | (uint)!bVar15 * auVar56._52_4_;
        bVar15 = (bool)(bVar21 >> 6 & 1);
        auVar51._56_4_ = (uint)bVar15 * auVar50._56_4_ | (uint)!bVar15 * auVar56._56_4_;
        auVar51._60_4_ =
             (uint)(bVar21 >> 7) * auVar50._60_4_ | (uint)!(bool)(bVar21 >> 7) * auVar56._60_4_;
        auVar46 = vextracti64x4_avx512f(auVar51,1);
        auVar50 = vpmulld_avx512f(auVar51,ZEXT3264(auVar46));
        auVar42 = vpmulld_avx(auVar50._0_16_,auVar50._16_16_);
        auVar44 = vpshufd_avx(auVar42,0xee);
        auVar42 = vpmulld_avx(auVar42,auVar44);
        auVar44 = vpshufd_avx(auVar42,0x55);
        auVar42 = vpmulld_avx(auVar42,auVar44);
        iVar75 = auVar42._0_4_;
      }
      auVar44._8_4_ = 0x80000000;
      auVar44._0_8_ = 0x8000000080000000;
      auVar44._12_4_ = 0x80000000;
      auVar42 = vxorps_avx512vl(ZEXT416((uint)(this->super_Trainer).eta),auVar44);
      fVar2 = this->epsilon;
      uVar33 = iVar75 * (this_00->values).d.bd;
      uVar36 = (ulong)uVar33;
      pfVar11 = (this_00->values).v;
      local_88 = auVar42._0_4_;
      local_64 = pfVar9;
      local_54 = (ulong)uVar32;
      local_3c = pfVar10;
      if (uVar33 != uVar31) goto LAB_00229a64;
      uVar26 = uVar36;
      if ((((ulong)pfVar11 & 3) == 0) &&
         (uVar26 = (ulong)(-((uint)((ulong)pfVar11 >> 2) & 0x3fffffff) & 0xf), uVar36 <= uVar26)) {
        uVar26 = uVar36;
      }
      uVar37 = uVar36 - uVar26;
      uVar35 = uVar37 + 0xf;
      if (-1 < (long)uVar37) {
        uVar35 = uVar37;
      }
      auVar42 = ZEXT416((uint)rVar1);
      if (uVar26 != 0) {
        uVar38 = 0;
        do {
          fVar17 = fVar2 + pfVar10[uVar38];
          auVar45 = vfnmadd213ss_fma(ZEXT416((uint)pfVar8[uVar38]),auVar42,
                                     ZEXT416((uint)pfVar11[uVar38]));
          auVar44 = vrsqrtss_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
          auVar43 = vfmadd213ss_avx512f(ZEXT416((uint)(fVar17 * auVar44._0_4_)),auVar44,
                                        ZEXT416(0xc0400000));
          auVar44 = vmulss_avx512f(auVar44,ZEXT416(0xbf000000));
          auVar44 = vfmadd231ss_fma(auVar45,ZEXT416((uint)(auVar44._0_4_ * auVar43._0_4_)),
                                    ZEXT416((uint)(local_a8 * local_88 * pfVar9[uVar38])));
          pfVar11[uVar38] = auVar44._0_4_;
          uVar38 = uVar38 + 1;
        } while (uVar26 != uVar38);
      }
      uVar35 = (uVar35 & 0xfffffffffffffff0) + uVar26;
      if (0xf < (long)uVar37) {
        auVar45._8_4_ = 0x80000000;
        auVar45._0_8_ = 0x8000000080000000;
        auVar45._12_4_ = 0x80000000;
        auVar44 = vxorps_avx512vl(auVar42,auVar45);
        auVar50 = vbroadcastss_avx512f(ZEXT416((uint)fVar2));
        auVar51 = vbroadcastss_avx512f(auVar44);
        auVar52 = vbroadcastss_avx512f(ZEXT416((uint)(local_a8 * local_88)));
        do {
          auVar54 = vaddps_avx512f(auVar50,*(undefined1 (*) [64])(pfVar10 + uVar26));
          auVar55 = vrsqrt14ps_avx512f(auVar54);
          auVar56 = vmulps_avx512f(auVar54,auVar47);
          auVar57 = vpaddd_avx512f(auVar54,auVar53);
          uVar20 = vptestnmd_avx512f(auVar54,auVar48);
          uVar19 = vpcmpud_avx512f(auVar57,auVar49,1);
          auVar57 = vmulps_avx512f(auVar52,*(undefined1 (*) [64])(pfVar9 + uVar26));
          uVar41 = ~((ushort)uVar20 | (ushort)uVar19);
          auVar58 = vmulps_avx512f(auVar55,auVar55);
          auVar54 = vmulps_avx512f(auVar54,auVar55);
          auVar55 = vfmadd213ps_avx512f(auVar58,auVar56,in_ZMM14);
          auVar54 = vmulps_avx512f(auVar54,auVar55);
          auVar59._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar54._4_4_;
          auVar59._0_4_ = (uint)((byte)uVar41 & 1) * auVar54._0_4_;
          auVar59._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar54._8_4_;
          auVar59._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar54._12_4_;
          auVar59._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar54._16_4_;
          auVar59._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar54._20_4_;
          auVar59._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar54._24_4_;
          auVar59._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar54._28_4_;
          bVar16 = (byte)(uVar41 >> 8);
          auVar59._32_4_ = (uint)(bVar16 & 1) * auVar54._32_4_;
          auVar59._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar54._36_4_;
          auVar59._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar54._40_4_;
          auVar59._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar54._44_4_;
          auVar59._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar54._48_4_;
          auVar59._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar54._52_4_;
          auVar59._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar54._56_4_;
          auVar59._60_4_ = (uint)(bVar16 >> 7) * auVar54._60_4_;
          auVar54 = vrcp14ps_avx512f(auVar59);
          auVar55 = vmulps_avx512f(auVar57,auVar54);
          auVar56 = vfmsub213ps_avx512f(auVar59,auVar55,auVar57);
          auVar57 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(pfVar8 + uVar26),auVar51,
                                        *(undefined1 (*) [64])(pfVar11 + uVar26));
          auVar54 = vfnmadd213ps_avx512f(auVar56,auVar54,auVar55);
          auVar54 = vaddps_avx512f(auVar57,auVar54);
          *(undefined1 (*) [64])(pfVar11 + uVar26) = auVar54;
          uVar26 = uVar26 + 0x10;
        } while ((long)uVar26 < (long)uVar35);
      }
      if ((long)uVar35 < (long)uVar36) {
        do {
          fVar17 = fVar2 + pfVar10[uVar35];
          auVar45 = vfnmadd213ss_fma(ZEXT416((uint)pfVar8[uVar35]),auVar42,
                                     ZEXT416((uint)pfVar11[uVar35]));
          auVar44 = vrsqrtss_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
          auVar43 = vfmadd213ss_avx512f(ZEXT416((uint)(fVar17 * auVar44._0_4_)),auVar44,
                                        ZEXT416(0xc0400000));
          auVar44 = vmulss_avx512f(auVar44,ZEXT416(0xbf000000));
          auVar44 = vfmadd231ss_fma(auVar45,ZEXT416((uint)(auVar44._0_4_ * auVar43._0_4_)),
                                    ZEXT416((uint)(local_a8 * local_88 * pfVar9[uVar35])));
          pfVar11[uVar35] = auVar44._0_4_;
          uVar35 = uVar35 + 1;
        } while (uVar36 != uVar35);
      }
      uVar34 = (ulong)((int)uVar34 + 1);
      auVar53 = ZEXT1664(auVar53._0_16_);
      fStack_9c = fStack_7c;
      uStack_98 = uStack_78;
      local_70 = local_a8;
      Parameters::clear(this_00);
      auVar47 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
      in_ZMM14 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
      auVar48 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
      auVar49 = vpbroadcastd_avx512f(ZEXT416(0x7fffff));
      auVar50 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar51 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar52 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      ppPVar40 = ppPVar40 + 1;
      auVar53 = vpternlogd_avx512f(auVar53,auVar53,auVar53,0xff);
    } while (ppPVar40 != ppPVar7);
    pMVar24 = (this->super_Trainer).model;
  }
  ppLVar27 = (pMVar24->lookup_params).
             super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppLVar12 = (pMVar24->lookup_params).
             super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar27 != ppLVar12) {
    fVar2 = fVar74 * scale;
    auVar47 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
    auVar48 = vpbroadcastd_avx512f(ZEXT416(0x3fc00000));
    auVar49 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
    auVar50 = vbroadcastss_avx512f(ZEXT416(0x7fffff));
    auVar51 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar52 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar53 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar54 = vpternlogd_avx512f(in_ZMM14,in_ZMM14,in_ZMM14,0xff);
    local_c8 = 0;
    do {
      this_01 = *ppLVar27;
      p_Var25 = (this_01->non_zero_grads)._M_h._M_before_begin._M_nxt;
      if (p_Var25 != (_Hash_node_base *)0x0) {
        pSVar6 = (this->vlp).
                 super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          uVar34 = (ulong)*(uint *)&p_Var25[1]._M_nxt;
          pTVar13 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          iVar76 = 1;
          iVar75 = 1;
          uVar36 = (ulong)pTVar13[uVar34].d.nd;
          if (uVar36 != 0) {
            auVar55 = vmovdqa64_avx512f(auVar51);
            auVar56 = vpbroadcastq_avx512f();
            uVar26 = 0;
            do {
              auVar57 = vpbroadcastq_avx512f();
              auVar58 = vmovdqa64_avx512f(auVar55);
              auVar55 = vporq_avx512f(auVar57,auVar52);
              auVar57 = vporq_avx512f(auVar57,auVar53);
              uVar19 = vpcmpuq_avx512f(auVar57,auVar56,2);
              bVar16 = (byte)uVar19;
              uVar19 = vpcmpuq_avx512f(auVar55,auVar56,2);
              bVar21 = (byte)uVar19;
              uVar41 = CONCAT11(bVar21,bVar16);
              auVar55 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar13[uVar34].d.d + uVar26));
              auVar57._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar55._4_4_;
              auVar57._0_4_ = (uint)(bVar16 & 1) * auVar55._0_4_;
              auVar57._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar55._8_4_;
              auVar57._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar55._12_4_;
              auVar57._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar55._16_4_;
              auVar57._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar55._20_4_;
              auVar57._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar55._24_4_;
              auVar57._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar55._28_4_;
              auVar57._32_4_ = (uint)(bVar21 & 1) * auVar55._32_4_;
              auVar57._36_4_ = (uint)(bVar21 >> 1 & 1) * auVar55._36_4_;
              auVar57._40_4_ = (uint)(bVar21 >> 2 & 1) * auVar55._40_4_;
              auVar57._44_4_ = (uint)(bVar21 >> 3 & 1) * auVar55._44_4_;
              auVar57._48_4_ = (uint)(bVar21 >> 4 & 1) * auVar55._48_4_;
              auVar57._52_4_ = (uint)(bVar21 >> 5 & 1) * auVar55._52_4_;
              auVar57._56_4_ = (uint)(bVar21 >> 6 & 1) * auVar55._56_4_;
              auVar57._60_4_ = (uint)(bVar21 >> 7) * auVar55._60_4_;
              uVar26 = uVar26 + 0x10;
              auVar55 = vpmulld_avx512f(auVar57,auVar58);
            } while ((uVar36 + 0xf & 0x1fffffff0) != uVar26);
            auVar55 = vmovdqa32_avx512f(auVar55);
            auVar60._0_4_ =
                 (uint)(bVar16 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar58._0_4_;
            bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar60._4_4_ = (uint)bVar15 * auVar55._4_4_ | (uint)!bVar15 * auVar58._4_4_;
            bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar60._8_4_ = (uint)bVar15 * auVar55._8_4_ | (uint)!bVar15 * auVar58._8_4_;
            bVar15 = (bool)((byte)(uVar41 >> 3) & 1);
            auVar60._12_4_ = (uint)bVar15 * auVar55._12_4_ | (uint)!bVar15 * auVar58._12_4_;
            bVar15 = (bool)((byte)(uVar41 >> 4) & 1);
            auVar60._16_4_ = (uint)bVar15 * auVar55._16_4_ | (uint)!bVar15 * auVar58._16_4_;
            bVar15 = (bool)((byte)(uVar41 >> 5) & 1);
            auVar60._20_4_ = (uint)bVar15 * auVar55._20_4_ | (uint)!bVar15 * auVar58._20_4_;
            bVar15 = (bool)((byte)(uVar41 >> 6) & 1);
            auVar60._24_4_ = (uint)bVar15 * auVar55._24_4_ | (uint)!bVar15 * auVar58._24_4_;
            bVar15 = (bool)((byte)(uVar41 >> 7) & 1);
            auVar60._28_4_ = (uint)bVar15 * auVar55._28_4_ | (uint)!bVar15 * auVar58._28_4_;
            auVar60._32_4_ =
                 (uint)(bVar21 & 1) * auVar55._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar58._32_4_;
            bVar15 = (bool)(bVar21 >> 1 & 1);
            auVar60._36_4_ = (uint)bVar15 * auVar55._36_4_ | (uint)!bVar15 * auVar58._36_4_;
            bVar15 = (bool)(bVar21 >> 2 & 1);
            auVar60._40_4_ = (uint)bVar15 * auVar55._40_4_ | (uint)!bVar15 * auVar58._40_4_;
            bVar15 = (bool)(bVar21 >> 3 & 1);
            auVar60._44_4_ = (uint)bVar15 * auVar55._44_4_ | (uint)!bVar15 * auVar58._44_4_;
            bVar15 = (bool)(bVar21 >> 4 & 1);
            auVar60._48_4_ = (uint)bVar15 * auVar55._48_4_ | (uint)!bVar15 * auVar58._48_4_;
            bVar15 = (bool)(bVar21 >> 5 & 1);
            auVar60._52_4_ = (uint)bVar15 * auVar55._52_4_ | (uint)!bVar15 * auVar58._52_4_;
            bVar15 = (bool)(bVar21 >> 6 & 1);
            auVar60._56_4_ = (uint)bVar15 * auVar55._56_4_ | (uint)!bVar15 * auVar58._56_4_;
            auVar60._60_4_ =
                 (uint)(bVar21 >> 7) * auVar55._60_4_ | (uint)!(bool)(bVar21 >> 7) * auVar58._60_4_;
            auVar46 = vextracti64x4_avx512f(auVar60,1);
            auVar55 = vpmulld_avx512f(auVar60,ZEXT3264(auVar46));
            auVar42 = vpmulld_avx(auVar55._0_16_,auVar55._16_16_);
            auVar44 = vpshufd_avx(auVar42,0xee);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            auVar44 = vpshufd_avx(auVar42,0x55);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            iVar75 = auVar42._0_4_;
          }
          pTVar14 = (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar36 = (ulong)pTVar14[uVar34].d.nd;
          if (uVar36 != 0) {
            auVar55 = vmovdqa64_avx512f(auVar51);
            auVar56 = vpbroadcastq_avx512f();
            uVar26 = 0;
            do {
              auVar57 = vpbroadcastq_avx512f();
              auVar58 = vmovdqa64_avx512f(auVar55);
              auVar55 = vporq_avx512f(auVar57,auVar52);
              auVar57 = vporq_avx512f(auVar57,auVar53);
              uVar19 = vpcmpuq_avx512f(auVar57,auVar56,2);
              bVar16 = (byte)uVar19;
              uVar19 = vpcmpuq_avx512f(auVar55,auVar56,2);
              bVar21 = (byte)uVar19;
              uVar41 = CONCAT11(bVar21,bVar16);
              auVar55 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar14[uVar34].d.d + uVar26));
              auVar61._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar55._4_4_;
              auVar61._0_4_ = (uint)(bVar16 & 1) * auVar55._0_4_;
              auVar61._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar55._8_4_;
              auVar61._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar55._12_4_;
              auVar61._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar55._16_4_;
              auVar61._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar55._20_4_;
              auVar61._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar55._24_4_;
              auVar61._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar55._28_4_;
              auVar61._32_4_ = (uint)(bVar21 & 1) * auVar55._32_4_;
              auVar61._36_4_ = (uint)(bVar21 >> 1 & 1) * auVar55._36_4_;
              auVar61._40_4_ = (uint)(bVar21 >> 2 & 1) * auVar55._40_4_;
              auVar61._44_4_ = (uint)(bVar21 >> 3 & 1) * auVar55._44_4_;
              auVar61._48_4_ = (uint)(bVar21 >> 4 & 1) * auVar55._48_4_;
              auVar61._52_4_ = (uint)(bVar21 >> 5 & 1) * auVar55._52_4_;
              auVar61._56_4_ = (uint)(bVar21 >> 6 & 1) * auVar55._56_4_;
              auVar61._60_4_ = (uint)(bVar21 >> 7) * auVar55._60_4_;
              uVar26 = uVar26 + 0x10;
              auVar55 = vpmulld_avx512f(auVar61,auVar58);
            } while ((uVar36 + 0xf & 0x1fffffff0) != uVar26);
            auVar55 = vmovdqa32_avx512f(auVar55);
            auVar62._0_4_ =
                 (uint)(bVar16 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar58._0_4_;
            bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar62._4_4_ = (uint)bVar15 * auVar55._4_4_ | (uint)!bVar15 * auVar58._4_4_;
            bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar62._8_4_ = (uint)bVar15 * auVar55._8_4_ | (uint)!bVar15 * auVar58._8_4_;
            bVar15 = (bool)((byte)(uVar41 >> 3) & 1);
            auVar62._12_4_ = (uint)bVar15 * auVar55._12_4_ | (uint)!bVar15 * auVar58._12_4_;
            bVar15 = (bool)((byte)(uVar41 >> 4) & 1);
            auVar62._16_4_ = (uint)bVar15 * auVar55._16_4_ | (uint)!bVar15 * auVar58._16_4_;
            bVar15 = (bool)((byte)(uVar41 >> 5) & 1);
            auVar62._20_4_ = (uint)bVar15 * auVar55._20_4_ | (uint)!bVar15 * auVar58._20_4_;
            bVar15 = (bool)((byte)(uVar41 >> 6) & 1);
            auVar62._24_4_ = (uint)bVar15 * auVar55._24_4_ | (uint)!bVar15 * auVar58._24_4_;
            bVar15 = (bool)((byte)(uVar41 >> 7) & 1);
            auVar62._28_4_ = (uint)bVar15 * auVar55._28_4_ | (uint)!bVar15 * auVar58._28_4_;
            auVar62._32_4_ =
                 (uint)(bVar21 & 1) * auVar55._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar58._32_4_;
            bVar15 = (bool)(bVar21 >> 1 & 1);
            auVar62._36_4_ = (uint)bVar15 * auVar55._36_4_ | (uint)!bVar15 * auVar58._36_4_;
            bVar15 = (bool)(bVar21 >> 2 & 1);
            auVar62._40_4_ = (uint)bVar15 * auVar55._40_4_ | (uint)!bVar15 * auVar58._40_4_;
            bVar15 = (bool)(bVar21 >> 3 & 1);
            auVar62._44_4_ = (uint)bVar15 * auVar55._44_4_ | (uint)!bVar15 * auVar58._44_4_;
            bVar15 = (bool)(bVar21 >> 4 & 1);
            auVar62._48_4_ = (uint)bVar15 * auVar55._48_4_ | (uint)!bVar15 * auVar58._48_4_;
            bVar15 = (bool)(bVar21 >> 5 & 1);
            auVar62._52_4_ = (uint)bVar15 * auVar55._52_4_ | (uint)!bVar15 * auVar58._52_4_;
            bVar15 = (bool)(bVar21 >> 6 & 1);
            auVar62._56_4_ = (uint)bVar15 * auVar55._56_4_ | (uint)!bVar15 * auVar58._56_4_;
            auVar62._60_4_ =
                 (uint)(bVar21 >> 7) * auVar55._60_4_ | (uint)!(bool)(bVar21 >> 7) * auVar58._60_4_;
            auVar46 = vextracti64x4_avx512f(auVar62,1);
            auVar55 = vpmulld_avx512f(auVar62,ZEXT3264(auVar46));
            auVar42 = vpmulld_avx(auVar55._0_16_,auVar55._16_16_);
            auVar44 = vpshufd_avx(auVar42,0xee);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            auVar44 = vpshufd_avx(auVar42,0x55);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            iVar76 = auVar42._0_4_;
          }
          lVar30 = *(long *)&pSVar6[local_c8].h.
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl +
                   uVar34 * 0x48;
          if ((ulong)*(uint *)(lVar30 + 0x1c) == 0) {
            iVar77 = 1;
          }
          else {
            auVar55 = vmovdqa64_avx512f(auVar51);
            auVar56 = vpbroadcastq_avx512f();
            uVar36 = 0;
            do {
              auVar57 = vpbroadcastq_avx512f();
              auVar58 = vmovdqa64_avx512f(auVar55);
              auVar55 = vporq_avx512f(auVar57,auVar52);
              auVar57 = vporq_avx512f(auVar57,auVar53);
              uVar19 = vpcmpuq_avx512f(auVar57,auVar56,2);
              bVar16 = (byte)uVar19;
              uVar19 = vpcmpuq_avx512f(auVar55,auVar56,2);
              bVar21 = (byte)uVar19;
              uVar41 = CONCAT11(bVar21,bVar16);
              auVar55 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar30 + uVar36 * 4));
              auVar63._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar55._4_4_;
              auVar63._0_4_ = (uint)(bVar16 & 1) * auVar55._0_4_;
              auVar63._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar55._8_4_;
              auVar63._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar55._12_4_;
              auVar63._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar55._16_4_;
              auVar63._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar55._20_4_;
              auVar63._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar55._24_4_;
              auVar63._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar55._28_4_;
              auVar63._32_4_ = (uint)(bVar21 & 1) * auVar55._32_4_;
              auVar63._36_4_ = (uint)(bVar21 >> 1 & 1) * auVar55._36_4_;
              auVar63._40_4_ = (uint)(bVar21 >> 2 & 1) * auVar55._40_4_;
              auVar63._44_4_ = (uint)(bVar21 >> 3 & 1) * auVar55._44_4_;
              auVar63._48_4_ = (uint)(bVar21 >> 4 & 1) * auVar55._48_4_;
              auVar63._52_4_ = (uint)(bVar21 >> 5 & 1) * auVar55._52_4_;
              auVar63._56_4_ = (uint)(bVar21 >> 6 & 1) * auVar55._56_4_;
              auVar63._60_4_ = (uint)(bVar21 >> 7) * auVar55._60_4_;
              uVar36 = uVar36 + 0x10;
              auVar55 = vpmulld_avx512f(auVar63,auVar58);
            } while (((ulong)*(uint *)(lVar30 + 0x1c) + 0xf & 0x1fffffff0) != uVar36);
            auVar55 = vmovdqa32_avx512f(auVar55);
            auVar64._0_4_ =
                 (uint)(bVar16 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar58._0_4_;
            bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar64._4_4_ = (uint)bVar15 * auVar55._4_4_ | (uint)!bVar15 * auVar58._4_4_;
            bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar64._8_4_ = (uint)bVar15 * auVar55._8_4_ | (uint)!bVar15 * auVar58._8_4_;
            bVar15 = (bool)((byte)(uVar41 >> 3) & 1);
            auVar64._12_4_ = (uint)bVar15 * auVar55._12_4_ | (uint)!bVar15 * auVar58._12_4_;
            bVar15 = (bool)((byte)(uVar41 >> 4) & 1);
            auVar64._16_4_ = (uint)bVar15 * auVar55._16_4_ | (uint)!bVar15 * auVar58._16_4_;
            bVar15 = (bool)((byte)(uVar41 >> 5) & 1);
            auVar64._20_4_ = (uint)bVar15 * auVar55._20_4_ | (uint)!bVar15 * auVar58._20_4_;
            bVar15 = (bool)((byte)(uVar41 >> 6) & 1);
            auVar64._24_4_ = (uint)bVar15 * auVar55._24_4_ | (uint)!bVar15 * auVar58._24_4_;
            bVar15 = (bool)((byte)(uVar41 >> 7) & 1);
            auVar64._28_4_ = (uint)bVar15 * auVar55._28_4_ | (uint)!bVar15 * auVar58._28_4_;
            auVar64._32_4_ =
                 (uint)(bVar21 & 1) * auVar55._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar58._32_4_;
            bVar15 = (bool)(bVar21 >> 1 & 1);
            auVar64._36_4_ = (uint)bVar15 * auVar55._36_4_ | (uint)!bVar15 * auVar58._36_4_;
            bVar15 = (bool)(bVar21 >> 2 & 1);
            auVar64._40_4_ = (uint)bVar15 * auVar55._40_4_ | (uint)!bVar15 * auVar58._40_4_;
            bVar15 = (bool)(bVar21 >> 3 & 1);
            auVar64._44_4_ = (uint)bVar15 * auVar55._44_4_ | (uint)!bVar15 * auVar58._44_4_;
            bVar15 = (bool)(bVar21 >> 4 & 1);
            auVar64._48_4_ = (uint)bVar15 * auVar55._48_4_ | (uint)!bVar15 * auVar58._48_4_;
            bVar15 = (bool)(bVar21 >> 5 & 1);
            auVar64._52_4_ = (uint)bVar15 * auVar55._52_4_ | (uint)!bVar15 * auVar58._52_4_;
            bVar15 = (bool)(bVar21 >> 6 & 1);
            auVar64._56_4_ = (uint)bVar15 * auVar55._56_4_ | (uint)!bVar15 * auVar58._56_4_;
            auVar64._60_4_ =
                 (uint)(bVar21 >> 7) * auVar55._60_4_ | (uint)!(bool)(bVar21 >> 7) * auVar58._60_4_;
            auVar46 = vextracti64x4_avx512f(auVar64,1);
            auVar55 = vpmulld_avx512f(auVar64,ZEXT3264(auVar46));
            auVar42 = vpmulld_avx(auVar55._0_16_,auVar55._16_16_);
            auVar44 = vpshufd_avx(auVar42,0xee);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            auVar44 = vpshufd_avx(auVar42,0x55);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            iVar77 = auVar42._0_4_;
          }
          rVar1 = (this->super_Trainer).lambda;
          uVar31 = iVar75 * pTVar13[uVar34].d.bd;
          uVar32 = iVar76 * pTVar14[uVar34].d.bd;
          uVar26 = (ulong)uVar32;
          uVar33 = iVar77 * *(int *)(lVar30 + 0x20);
          uVar35 = (ulong)uVar33;
          pfVar8 = pTVar13[uVar34].v;
          pfVar9 = pTVar14[uVar34].v;
          uVar36 = *(ulong *)(lVar30 + 0x28);
          fStack_7c = SUB84(pfVar9,0);
          uStack_78 = (undefined4)((ulong)pfVar9 >> 0x20);
          if (uVar33 != uVar32) goto LAB_00229a92;
          uVar37 = uVar35;
          if (((uVar36 & 3) == 0) &&
             (uVar37 = (ulong)(-((uint)(uVar36 >> 2) & 0x3fffffff) & 0xf), uVar35 <= uVar37)) {
            uVar37 = uVar35;
          }
          uVar39 = uVar35 - uVar37;
          uVar38 = uVar39 + 0xf;
          if (-1 < (long)uVar39) {
            uVar38 = uVar39;
          }
          if (uVar37 != 0) {
            uVar28 = 0;
            do {
              auVar42 = vfmadd213ss_fma(ZEXT416((uint)(fVar2 * pfVar9[uVar28])),
                                        ZEXT416((uint)(fVar2 * pfVar9[uVar28])),
                                        ZEXT416(*(uint *)(uVar36 + uVar28 * 4)));
              *(int *)(uVar36 + uVar28 * 4) = auVar42._0_4_;
              uVar28 = uVar28 + 1;
            } while (uVar37 != uVar28);
          }
          uVar38 = (uVar38 & 0xfffffffffffffff0) + uVar37;
          if (0xf < (long)uVar39) {
            auVar43._0_4_ = fVar2 * fVar2;
            auVar43._4_4_ = fStack_a4 * fStack_84;
            auVar43._8_4_ = fStack_a0 * fStack_80;
            auVar43._12_4_ = fStack_7c * fStack_7c;
            auVar55 = vbroadcastss_avx512f(auVar43);
            do {
              auVar56 = vmulps_avx512f(*(undefined1 (*) [64])(pfVar9 + uVar37),
                                       *(undefined1 (*) [64])(pfVar9 + uVar37));
              auVar56 = vfmadd213ps_avx512f(auVar56,auVar55,
                                            *(undefined1 (*) [64])(uVar36 + uVar37 * 4));
              *(undefined1 (*) [64])(uVar36 + uVar37 * 4) = auVar56;
              uVar37 = uVar37 + 0x10;
            } while ((long)uVar37 < (long)uVar38);
          }
          if ((long)uVar38 < (long)uVar35) {
            do {
              auVar42 = vfmadd213ss_fma(ZEXT416((uint)(fVar2 * pfVar9[uVar38])),
                                        ZEXT416((uint)(fVar2 * pfVar9[uVar38])),
                                        ZEXT416(*(uint *)(uVar36 + uVar38 * 4)));
              *(int *)(uVar36 + uVar38 * 4) = auVar42._0_4_;
              uVar38 = uVar38 + 1;
            } while (uVar35 != uVar38);
          }
          pfVar10 = *(float **)(lVar30 + 0x28);
          if ((ulong)*(uint *)(lVar30 + 0x1c) == 0) {
            iVar75 = 1;
          }
          else {
            auVar55 = vmovdqa64_avx512f(auVar51);
            auVar56 = vpbroadcastq_avx512f();
            uVar36 = 0;
            do {
              auVar57 = vpbroadcastq_avx512f();
              auVar58 = vmovdqa64_avx512f(auVar55);
              auVar55 = vporq_avx512f(auVar57,auVar52);
              auVar57 = vporq_avx512f(auVar57,auVar53);
              uVar19 = vpcmpuq_avx512f(auVar57,auVar56,2);
              bVar16 = (byte)uVar19;
              uVar19 = vpcmpuq_avx512f(auVar55,auVar56,2);
              bVar21 = (byte)uVar19;
              uVar41 = CONCAT11(bVar21,bVar16);
              auVar55 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar30 + uVar36 * 4));
              auVar65._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar55._4_4_;
              auVar65._0_4_ = (uint)(bVar16 & 1) * auVar55._0_4_;
              auVar65._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar55._8_4_;
              auVar65._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar55._12_4_;
              auVar65._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar55._16_4_;
              auVar65._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar55._20_4_;
              auVar65._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar55._24_4_;
              auVar65._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar55._28_4_;
              auVar65._32_4_ = (uint)(bVar21 & 1) * auVar55._32_4_;
              auVar65._36_4_ = (uint)(bVar21 >> 1 & 1) * auVar55._36_4_;
              auVar65._40_4_ = (uint)(bVar21 >> 2 & 1) * auVar55._40_4_;
              auVar65._44_4_ = (uint)(bVar21 >> 3 & 1) * auVar55._44_4_;
              auVar65._48_4_ = (uint)(bVar21 >> 4 & 1) * auVar55._48_4_;
              auVar65._52_4_ = (uint)(bVar21 >> 5 & 1) * auVar55._52_4_;
              auVar65._56_4_ = (uint)(bVar21 >> 6 & 1) * auVar55._56_4_;
              auVar65._60_4_ = (uint)(bVar21 >> 7) * auVar55._60_4_;
              uVar36 = uVar36 + 0x10;
              auVar55 = vpmulld_avx512f(auVar65,auVar58);
            } while (((ulong)*(uint *)(lVar30 + 0x1c) + 0xf & 0x1fffffff0) != uVar36);
            auVar55 = vmovdqa32_avx512f(auVar55);
            auVar66._0_4_ =
                 (uint)(bVar16 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar58._0_4_;
            bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar66._4_4_ = (uint)bVar15 * auVar55._4_4_ | (uint)!bVar15 * auVar58._4_4_;
            bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar66._8_4_ = (uint)bVar15 * auVar55._8_4_ | (uint)!bVar15 * auVar58._8_4_;
            bVar15 = (bool)((byte)(uVar41 >> 3) & 1);
            auVar66._12_4_ = (uint)bVar15 * auVar55._12_4_ | (uint)!bVar15 * auVar58._12_4_;
            bVar15 = (bool)((byte)(uVar41 >> 4) & 1);
            auVar66._16_4_ = (uint)bVar15 * auVar55._16_4_ | (uint)!bVar15 * auVar58._16_4_;
            bVar15 = (bool)((byte)(uVar41 >> 5) & 1);
            auVar66._20_4_ = (uint)bVar15 * auVar55._20_4_ | (uint)!bVar15 * auVar58._20_4_;
            bVar15 = (bool)((byte)(uVar41 >> 6) & 1);
            auVar66._24_4_ = (uint)bVar15 * auVar55._24_4_ | (uint)!bVar15 * auVar58._24_4_;
            bVar15 = (bool)((byte)(uVar41 >> 7) & 1);
            auVar66._28_4_ = (uint)bVar15 * auVar55._28_4_ | (uint)!bVar15 * auVar58._28_4_;
            auVar66._32_4_ =
                 (uint)(bVar21 & 1) * auVar55._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar58._32_4_;
            bVar15 = (bool)(bVar21 >> 1 & 1);
            auVar66._36_4_ = (uint)bVar15 * auVar55._36_4_ | (uint)!bVar15 * auVar58._36_4_;
            bVar15 = (bool)(bVar21 >> 2 & 1);
            auVar66._40_4_ = (uint)bVar15 * auVar55._40_4_ | (uint)!bVar15 * auVar58._40_4_;
            bVar15 = (bool)(bVar21 >> 3 & 1);
            auVar66._44_4_ = (uint)bVar15 * auVar55._44_4_ | (uint)!bVar15 * auVar58._44_4_;
            bVar15 = (bool)(bVar21 >> 4 & 1);
            auVar66._48_4_ = (uint)bVar15 * auVar55._48_4_ | (uint)!bVar15 * auVar58._48_4_;
            bVar15 = (bool)(bVar21 >> 5 & 1);
            auVar66._52_4_ = (uint)bVar15 * auVar55._52_4_ | (uint)!bVar15 * auVar58._52_4_;
            bVar15 = (bool)(bVar21 >> 6 & 1);
            auVar66._56_4_ = (uint)bVar15 * auVar55._56_4_ | (uint)!bVar15 * auVar58._56_4_;
            auVar66._60_4_ =
                 (uint)(bVar21 >> 7) * auVar55._60_4_ | (uint)!(bool)(bVar21 >> 7) * auVar58._60_4_;
            auVar46 = vextracti64x4_avx512f(auVar66,1);
            auVar55 = vpmulld_avx512f(auVar66,ZEXT3264(auVar46));
            auVar42 = vpmulld_avx(auVar55._0_16_,auVar55._16_16_);
            auVar44 = vpshufd_avx(auVar42,0xee);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            auVar44 = vpshufd_avx(auVar42,0x55);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            iVar75 = auVar42._0_4_;
          }
          if (uVar32 - iVar75 * *(int *)(lVar30 + 0x20) != 0) goto LAB_00229a7b;
          if (uVar32 != uVar31) goto LAB_00229ab4;
          pTVar13 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar36 = (ulong)pTVar13[uVar34].d.nd;
          if (uVar36 == 0) {
            iVar75 = 1;
          }
          else {
            auVar55 = vmovdqa64_avx512f(auVar51);
            auVar56 = vpbroadcastq_avx512f();
            uVar35 = 0;
            do {
              auVar57 = vpbroadcastq_avx512f();
              auVar58 = vmovdqa64_avx512f(auVar55);
              auVar55 = vporq_avx512f(auVar57,auVar52);
              auVar57 = vporq_avx512f(auVar57,auVar53);
              uVar19 = vpcmpuq_avx512f(auVar57,auVar56,2);
              bVar16 = (byte)uVar19;
              uVar19 = vpcmpuq_avx512f(auVar55,auVar56,2);
              bVar21 = (byte)uVar19;
              uVar41 = CONCAT11(bVar21,bVar16);
              auVar55 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar13[uVar34].d.d + uVar35));
              auVar67._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar55._4_4_;
              auVar67._0_4_ = (uint)(bVar16 & 1) * auVar55._0_4_;
              auVar67._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar55._8_4_;
              auVar67._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar55._12_4_;
              auVar67._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar55._16_4_;
              auVar67._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar55._20_4_;
              auVar67._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar55._24_4_;
              auVar67._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar55._28_4_;
              auVar67._32_4_ = (uint)(bVar21 & 1) * auVar55._32_4_;
              auVar67._36_4_ = (uint)(bVar21 >> 1 & 1) * auVar55._36_4_;
              auVar67._40_4_ = (uint)(bVar21 >> 2 & 1) * auVar55._40_4_;
              auVar67._44_4_ = (uint)(bVar21 >> 3 & 1) * auVar55._44_4_;
              auVar67._48_4_ = (uint)(bVar21 >> 4 & 1) * auVar55._48_4_;
              auVar67._52_4_ = (uint)(bVar21 >> 5 & 1) * auVar55._52_4_;
              auVar67._56_4_ = (uint)(bVar21 >> 6 & 1) * auVar55._56_4_;
              auVar67._60_4_ = (uint)(bVar21 >> 7) * auVar55._60_4_;
              uVar35 = uVar35 + 0x10;
              auVar55 = vpmulld_avx512f(auVar67,auVar58);
            } while ((uVar36 + 0xf & 0x1fffffff0) != uVar35);
            auVar55 = vmovdqa32_avx512f(auVar55);
            auVar68._0_4_ =
                 (uint)(bVar16 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar16 & 1) * auVar58._0_4_;
            bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
            auVar68._4_4_ = (uint)bVar15 * auVar55._4_4_ | (uint)!bVar15 * auVar58._4_4_;
            bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
            auVar68._8_4_ = (uint)bVar15 * auVar55._8_4_ | (uint)!bVar15 * auVar58._8_4_;
            bVar15 = (bool)((byte)(uVar41 >> 3) & 1);
            auVar68._12_4_ = (uint)bVar15 * auVar55._12_4_ | (uint)!bVar15 * auVar58._12_4_;
            bVar15 = (bool)((byte)(uVar41 >> 4) & 1);
            auVar68._16_4_ = (uint)bVar15 * auVar55._16_4_ | (uint)!bVar15 * auVar58._16_4_;
            bVar15 = (bool)((byte)(uVar41 >> 5) & 1);
            auVar68._20_4_ = (uint)bVar15 * auVar55._20_4_ | (uint)!bVar15 * auVar58._20_4_;
            bVar15 = (bool)((byte)(uVar41 >> 6) & 1);
            auVar68._24_4_ = (uint)bVar15 * auVar55._24_4_ | (uint)!bVar15 * auVar58._24_4_;
            bVar15 = (bool)((byte)(uVar41 >> 7) & 1);
            auVar68._28_4_ = (uint)bVar15 * auVar55._28_4_ | (uint)!bVar15 * auVar58._28_4_;
            auVar68._32_4_ =
                 (uint)(bVar21 & 1) * auVar55._32_4_ | (uint)!(bool)(bVar21 & 1) * auVar58._32_4_;
            bVar15 = (bool)(bVar21 >> 1 & 1);
            auVar68._36_4_ = (uint)bVar15 * auVar55._36_4_ | (uint)!bVar15 * auVar58._36_4_;
            bVar15 = (bool)(bVar21 >> 2 & 1);
            auVar68._40_4_ = (uint)bVar15 * auVar55._40_4_ | (uint)!bVar15 * auVar58._40_4_;
            bVar15 = (bool)(bVar21 >> 3 & 1);
            auVar68._44_4_ = (uint)bVar15 * auVar55._44_4_ | (uint)!bVar15 * auVar58._44_4_;
            bVar15 = (bool)(bVar21 >> 4 & 1);
            auVar68._48_4_ = (uint)bVar15 * auVar55._48_4_ | (uint)!bVar15 * auVar58._48_4_;
            bVar15 = (bool)(bVar21 >> 5 & 1);
            auVar68._52_4_ = (uint)bVar15 * auVar55._52_4_ | (uint)!bVar15 * auVar58._52_4_;
            bVar15 = (bool)(bVar21 >> 6 & 1);
            auVar68._56_4_ = (uint)bVar15 * auVar55._56_4_ | (uint)!bVar15 * auVar58._56_4_;
            auVar68._60_4_ =
                 (uint)(bVar21 >> 7) * auVar55._60_4_ | (uint)!(bool)(bVar21 >> 7) * auVar58._60_4_;
            auVar46 = vextracti64x4_avx512f(auVar68,1);
            auVar55 = vpmulld_avx512f(auVar68,ZEXT3264(auVar46));
            auVar42 = vpmulld_avx(auVar55._0_16_,auVar55._16_16_);
            auVar44 = vpshufd_avx(auVar42,0xee);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            auVar44 = vpshufd_avx(auVar42,0x55);
            auVar42 = vpmulld_avx(auVar42,auVar44);
            iVar75 = auVar42._0_4_;
          }
          local_88 = -(this->super_Trainer).eta;
          fVar17 = this->epsilon;
          uVar32 = iVar75 * pTVar13[uVar34].d.bd;
          uVar36 = (ulong)uVar32;
          pfVar11 = pTVar13[uVar34].v;
          local_64 = pfVar9;
          local_54 = uVar26;
          local_3c = pfVar10;
          if (uVar32 != uVar31) goto LAB_00229a64;
          uVar34 = uVar36;
          if ((((ulong)pfVar11 & 3) == 0) &&
             (uVar34 = (ulong)(-((uint)((ulong)pfVar11 >> 2) & 0x3fffffff) & 0xf), uVar36 <= uVar34)
             ) {
            uVar34 = uVar36;
          }
          uVar35 = uVar36 - uVar34;
          uVar26 = uVar35 + 0xf;
          if (-1 < (long)uVar35) {
            uVar26 = uVar35;
          }
          if (uVar34 != 0) {
            uVar37 = 0;
            do {
              fVar18 = fVar17 + pfVar10[uVar37];
              auVar44 = vfnmadd213ss_fma(ZEXT416((uint)pfVar8[uVar37]),ZEXT416((uint)rVar1),
                                         ZEXT416((uint)pfVar11[uVar37]));
              auVar42 = vrsqrtss_avx(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18));
              auVar45 = vfmadd213ss_avx512f(ZEXT416((uint)(fVar18 * auVar42._0_4_)),auVar42,
                                            ZEXT416(0xc0400000));
              auVar42 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
              auVar42 = vfmadd231ss_fma(auVar44,ZEXT416((uint)(auVar42._0_4_ * auVar45._0_4_)),
                                        ZEXT416((uint)(fVar2 * local_88 * pfVar9[uVar37])));
              pfVar11[uVar37] = auVar42._0_4_;
              uVar37 = uVar37 + 1;
            } while (uVar34 != uVar37);
          }
          uVar26 = (uVar26 & 0xfffffffffffffff0) + uVar34;
          if (0xf < (long)uVar35) {
            auVar78._0_4_ = -rVar1;
            auVar78._4_4_ = 0x80000000;
            auVar78._8_4_ = 0x80000000;
            auVar78._12_4_ = 0x80000000;
            auVar55 = vbroadcastss_avx512f(ZEXT416((uint)fVar17));
            auVar56 = vbroadcastss_avx512f(auVar78);
            auVar57 = vbroadcastss_avx512f(ZEXT416((uint)(fVar2 * local_88)));
            do {
              auVar58 = vaddps_avx512f(auVar55,*(undefined1 (*) [64])(pfVar10 + uVar34));
              auVar69 = vrsqrt14ps_avx512f(auVar58);
              auVar70 = vmulps_avx512f(auVar58,auVar47);
              auVar71 = vpaddd_avx512f(auVar58,auVar54);
              uVar20 = vptestnmd_avx512f(auVar58,auVar49);
              uVar19 = vpcmpud_avx512f(auVar71,auVar50,1);
              auVar71 = vmulps_avx512f(auVar57,*(undefined1 (*) [64])(pfVar9 + uVar34));
              uVar41 = ~((ushort)uVar20 | (ushort)uVar19);
              auVar72 = vmulps_avx512f(auVar69,auVar69);
              auVar58 = vmulps_avx512f(auVar58,auVar69);
              auVar69 = vfmadd213ps_avx512f(auVar72,auVar70,auVar48);
              auVar58 = vmulps_avx512f(auVar58,auVar69);
              auVar73._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar58._4_4_;
              auVar73._0_4_ = (uint)((byte)uVar41 & 1) * auVar58._0_4_;
              auVar73._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar58._8_4_;
              auVar73._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar58._12_4_;
              auVar73._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * auVar58._16_4_;
              auVar73._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * auVar58._20_4_;
              auVar73._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * auVar58._24_4_;
              auVar73._28_4_ = (uint)((byte)(uVar41 >> 7) & 1) * auVar58._28_4_;
              bVar16 = (byte)(uVar41 >> 8);
              auVar73._32_4_ = (uint)(bVar16 & 1) * auVar58._32_4_;
              auVar73._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar58._36_4_;
              auVar73._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar58._40_4_;
              auVar73._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar58._44_4_;
              auVar73._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar58._48_4_;
              auVar73._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar58._52_4_;
              auVar73._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar58._56_4_;
              auVar73._60_4_ = (uint)(bVar16 >> 7) * auVar58._60_4_;
              auVar58 = vrcp14ps_avx512f(auVar73);
              auVar69 = vmulps_avx512f(auVar71,auVar58);
              auVar70 = vfmsub213ps_avx512f(auVar73,auVar69,auVar71);
              auVar71 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(pfVar8 + uVar34),auVar56,
                                            *(undefined1 (*) [64])(pfVar11 + uVar34));
              auVar58 = vfnmadd213ps_avx512f(auVar70,auVar58,auVar69);
              auVar58 = vaddps_avx512f(auVar71,auVar58);
              *(undefined1 (*) [64])(pfVar11 + uVar34) = auVar58;
              uVar34 = uVar34 + 0x10;
            } while ((long)uVar34 < (long)uVar26);
          }
          if ((long)uVar26 < (long)uVar36) {
            do {
              fVar18 = fVar17 + pfVar10[uVar26];
              auVar44 = vfnmadd213ss_fma(ZEXT416((uint)pfVar8[uVar26]),ZEXT416((uint)rVar1),
                                         ZEXT416((uint)pfVar11[uVar26]));
              auVar42 = vrsqrtss_avx(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18));
              auVar45 = vfmadd213ss_avx512f(ZEXT416((uint)(fVar18 * auVar42._0_4_)),auVar42,
                                            ZEXT416(0xc0400000));
              auVar42 = vmulss_avx512f(auVar42,ZEXT416(0xbf000000));
              auVar42 = vfmadd231ss_fma(auVar44,ZEXT416((uint)(auVar42._0_4_ * auVar45._0_4_)),
                                        ZEXT416((uint)(fVar2 * local_88 * pfVar9[uVar26])));
              pfVar11[uVar26] = auVar42._0_4_;
              uVar26 = uVar26 + 1;
            } while (uVar36 != uVar26);
          }
          p_Var25 = p_Var25->_M_nxt;
          local_a8 = fVar2;
          fStack_9c = fStack_7c;
          uStack_98 = uStack_78;
          local_70 = fVar2;
        } while (p_Var25 != (_Hash_node_base *)0x0);
      }
      local_c8 = (ulong)((int)local_c8 + 1);
      auVar54 = ZEXT1664(auVar54._0_16_);
      LookupParameters::clear(this_01);
      auVar48 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
      auVar47 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
      auVar53 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar52 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar51 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar50 = vbroadcastss_avx512f(ZEXT416(0x7fffff));
      auVar49 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
      auVar54 = vpternlogd_avx512f(auVar54,auVar54,auVar54,0xff);
      ppLVar27 = ppLVar27 + 1;
    } while (ppLVar27 != ppLVar12);
  }
  (this->super_Trainer).updates = (this->super_Trainer).updates + 1.0;
  return;
LAB_00229a92:
  local_a8 = fVar74 * scale;
  pcVar29 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
  ;
  local_88 = local_a8;
  goto LAB_00229aa7;
LAB_00229a7b:
  pcVar29 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>]"
  ;
  goto LAB_00229ac9;
LAB_00229ab4:
  pcVar29 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, Rhs ..." /* TRUNCATED STRING LITERAL */
  ;
LAB_00229ac9:
  local_88 = fVar74 * scale;
  local_a8 = fVar74 * scale;
  fStack_9c = fStack_7c;
  uStack_98 = uStack_78;
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar29);
LAB_00229a64:
  local_a8 = fVar74 * scale;
  pcVar29 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
  ;
  local_70 = local_a8;
LAB_00229aa7:
  local_a8 = fVar74 * scale;
  fStack_9c = fStack_7c;
  uStack_98 = uStack_78;
  __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar29);
}

Assistant:

void AdagradTrainer::update(real scale) {
  unsigned pi;
  if (!shadow_params_allocated) {
    vp = AllocateShadowParameters(*model);
    vlp = AllocateShadowLookupParameters(*model);
    shadow_params_allocated = true;
  }

  pi = 0;
  const float gscale = clip_gradients();
  for (auto p : model->parameters_list()) {
    Tensor& v = vp[pi++].h;
    auto reg = p->values.vec() * lambda;
    auto g = scale * gscale * p->g.vec();
    auto g2 = g.cwiseProduct(g);
    v.vec() += g2;
    auto delta = -eta * g.cwiseQuotient((v.vec().array() + epsilon).matrix().cwiseSqrt());
    p->values.vec() += delta - reg;
    p->clear();
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<Tensor>& vx = vlp[pi++].h;
    for (auto i : p->non_zero_grads) {
      Tensor& v = vx[i];
      auto reg = p->values[i].vec() * lambda;
      auto g = scale * gscale * p->grads[i].vec();
      auto g2 = g.cwiseProduct(g);
      v.vec() += g2;
      auto delta = -eta * g.cwiseQuotient((v.vec().array() + epsilon).matrix().cwiseSqrt());
      p->values[i].vec() += delta - reg;
    }
    p->clear();
  }

  ++updates;
}